

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O0

void __thiscall avro::NodeFixed::printJson(NodeFixed *this,ostream *os,int depth)

{
  ostream *poVar1;
  int *piVar2;
  ostream *poVar3;
  int in_EDX;
  ostream *in_RSI;
  ostream *in_RDI;
  SingleAttribute<avro::Name> *unaff_retaddr;
  undefined8 in_stack_ffffffffffffffd0;
  indent iVar4;
  Name *in_stack_ffffffffffffffd8;
  ostream *in_stack_ffffffffffffffe0;
  indent local_18;
  int local_14;
  
  iVar4.d = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  local_14 = in_EDX;
  poVar3 = in_RDI;
  std::operator<<(in_RSI,"{\n");
  local_14 = local_14 + 1;
  indent::indent(&local_18,local_14);
  poVar1 = operator<<(in_RDI,iVar4);
  std::operator<<(poVar1,"\"type\": \"fixed\",\n");
  concepts::SingleAttribute<avro::Name>::get(unaff_retaddr,(size_t)poVar3);
  printName(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,iVar4.d);
  indent::indent((indent *)&stack0xffffffffffffffe4,local_14);
  poVar1 = operator<<(in_RDI,iVar4);
  poVar1 = std::operator<<(poVar1,"\"size\": ");
  piVar2 = concepts::SingleAttribute<int>::get((SingleAttribute<int> *)unaff_retaddr,(size_t)poVar3)
  ;
  poVar3 = (ostream *)std::ostream::operator<<(poVar1,*piVar2);
  iVar4.d = (int)((ulong)poVar1 >> 0x20);
  std::operator<<(poVar3,"\n");
  local_14 = local_14 + -1;
  indent::indent((indent *)&stack0xffffffffffffffe0,local_14);
  poVar3 = operator<<(in_RDI,iVar4);
  std::operator<<(poVar3,'}');
  return;
}

Assistant:

void 
NodeFixed::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(++depth) << "\"type\": \"fixed\",\n";
    printName(os, nameAttribute_.get(), depth);
    os << indent(depth) << "\"size\": " << sizeAttribute_.get() << "\n";
    os << indent(--depth) << '}';
}